

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O1

void http_on_request_handler______internal(http_s *h,http_settings_s *settings)

{
  int *piVar1;
  FIOBJ hash;
  ulong uVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  FIOBJ ary;
  FIOBJ obj;
  FIOBJ FVar8;
  uint64_t key_hash;
  fiobj_object_vtable_s *pfVar9;
  size_t sVar10;
  uint uVar11;
  fio_str_info_s val;
  fio_str_info_s local_48;
  
  if (http_upgrade_hash == 0) {
    http_upgrade_hash = fio_siphash13("upgrade",7,0x144e87,0x1453b6);
  }
  h->udata = settings->udata;
  if (http_on_request_handler______internal::host_hash == 0) {
    http_on_request_handler______internal::host_hash = fio_siphash13("host",4,0x144e87,0x1453b6);
  }
  ary = fiobj_hash_get2(h->headers,http_on_request_handler______internal::host_hash);
  FVar8 = HTTP_HEADER_HOST;
  if (ary == 0) {
LAB_00151f46:
    if (4 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http_internal.c:72): missing Host header"
                    );
    }
    http_send_error(h,400);
    return;
  }
  if (((~(uint)ary & 6) != 0 && (ary & 1) == 0) && (*(char *)(ary & 0xfffffffffffffff8) == ')')) {
    hash = h->headers;
    obj = fiobj_ary_pop(ary);
    fiobj_hash_set(hash,FVar8,obj);
  }
  if (ary == 0) goto LAB_00151f46;
  FVar8 = fiobj_hash_get2(h->headers,http_upgrade_hash);
  if (FVar8 != 0) {
    uVar6 = (uint)FVar8;
    uVar5 = uVar6 & 6;
    if (uVar5 != 6 && (FVar8 & 1) == 0) {
      LOCK();
      piVar1 = (int *)((FVar8 & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    if ((FVar8 & 1) != 0) {
      fio_ltocstr(&local_48,(long)FVar8 >> 1);
      goto LAB_00152116;
    }
    uVar11 = 0x28;
    switch(uVar5) {
    case 0:
switchD_00151f36_caseD_0:
      uVar11 = (uint)*(byte *)(FVar8 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00151f36_caseD_4:
      uVar11 = 0x2a;
      break;
    case 6:
      if ((char)FVar8 == '&') {
        local_48.data = anon_var_dwarf_21a;
        local_48.len._0_4_ = 5;
      }
      else if ((uVar6 & 0xff) == 0x16) {
        local_48.data = anon_var_dwarf_225;
        local_48.len._0_4_ = 4;
      }
      else {
        if ((uVar6 & 0xff) != 6) {
          switch(uVar5) {
          case 0:
            goto switchD_00151f36_caseD_0;
          case 4:
            goto switchD_00151f36_caseD_4;
          case 6:
            uVar11 = uVar6;
          }
          break;
        }
        local_48.data = anon_var_dwarf_20f;
        local_48.len._0_4_ = 4;
      }
      local_48.capa._0_4_ = 0;
      local_48.capa._4_4_ = 0;
      local_48.len._4_4_ = 0;
      goto LAB_00152116;
    }
    switch(uVar11 & 0xff) {
    case 0x27:
      pfVar9 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      pfVar9 = &FIOBJECT_VTABLE_STRING;
      break;
    case 0x29:
      pfVar9 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      pfVar9 = &FIOBJECT_VTABLE_HASH;
      break;
    case 0x2b:
      pfVar9 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar9 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar9->to_str)(&local_48,FVar8);
LAB_00152116:
    if ((*local_48.data == 'h') && (local_48.data[1] == '2')) {
      http_send_error(h,400);
    }
    else {
      (*settings->on_upgrade)(h,local_48.data,CONCAT44(local_48.len._4_4_,(undefined4)local_48.len))
      ;
    }
    fiobj_free(FVar8);
    return;
  }
  FVar8 = h->headers;
  key_hash = fiobj_obj2hash(HTTP_HEADER_ACCEPT);
  FVar8 = fiobj_hash_get2(FVar8,key_hash);
  if (FVar8 == HTTP_HVALUE_SSE_MIME) {
LAB_00151f9f:
    (*settings->on_upgrade)(h,"sse",3);
    return;
  }
  if ((HTTP_HVALUE_SSE_MIME != 0 && FVar8 != 0) && ((~(uint)HTTP_HVALUE_SSE_MIME & 6) != 0)) {
    uVar6 = (uint)FVar8;
    uVar5 = uVar6 & 6;
    if ((uVar5 != 6) && ((((uint)HTTP_HVALUE_SSE_MIME | uVar6) & 1) == 0)) {
      bVar3 = *(byte *)(FVar8 & 0xfffffffffffffff8);
      if (bVar3 == *(byte *)(HTTP_HVALUE_SSE_MIME & 0xfffffffffffffff8)) {
        uVar11 = 1;
        if ((FVar8 & 1) == 0) {
          switch(uVar5) {
          case 0:
            uVar11 = (uint)bVar3;
            break;
          case 2:
            uVar11 = 0x28;
            break;
          case 4:
            uVar11 = 0x2a;
            break;
          case 6:
            uVar11 = uVar6;
          }
        }
        uVar6 = (uVar11 & 0xff) - 0x27;
        if (uVar6 < 5) {
          (*(code *)(&DAT_0016afdc + *(int *)(&DAT_0016afdc + (ulong)uVar6 * 4)))();
          return;
        }
        sVar10 = fiobj_i_is_eq(FVar8,HTTP_HVALUE_SSE_MIME);
        if (sVar10 != 0) {
          bVar3 = 1;
          if ((FVar8 & 1) == 0) {
            switch(uVar5) {
            case 0:
              bVar3 = *(byte *)(FVar8 & 0xfffffffffffffff8);
              break;
            case 2:
              bVar3 = 0x28;
              break;
            case 4:
              bVar3 = 0x2a;
              break;
            case 6:
              bVar3 = (byte)FVar8;
            }
          }
          if (bVar3 - 0x27 < 5) {
            (*(code *)(&DAT_0016b00c + *(int *)(&DAT_0016b00c + (ulong)(bVar3 - 0x27) * 4)))();
            return;
          }
          goto LAB_00151f9f;
        }
      }
    }
  }
  if (settings->public_folder == (char *)0x0) goto LAB_00152416;
  uVar2 = h->path;
  if (uVar2 == 0) {
LAB_00152347:
    local_48.data = anon_var_dwarf_20f;
    local_48.len._0_4_ = 4;
    goto LAB_0015235a;
  }
  if ((uVar2 & 1) == 0) {
    uVar5 = (uint)uVar2 & 6;
    cVar4 = '(';
    switch(uVar5) {
    case 0:
switchD_00152316_caseD_0:
      cVar4 = *(char *)(uVar2 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00152316_caseD_4:
      cVar4 = '*';
      break;
    case 6:
      if ((char)uVar2 == '&') {
        local_48.data = anon_var_dwarf_21a;
        local_48.len._0_4_ = 5;
      }
      else {
        uVar6 = (uint)uVar2 & 0xff;
        if (uVar6 != 0x16) {
          if (uVar6 == 6) goto LAB_00152347;
          switch(uVar5) {
          case 0:
            goto switchD_00152316_caseD_0;
          case 4:
            goto switchD_00152316_caseD_4;
          case 6:
            cVar4 = (char)uVar2;
          }
          break;
        }
        local_48.data = anon_var_dwarf_225;
        local_48.len._0_4_ = 4;
      }
LAB_0015235a:
      local_48.capa._0_4_ = 0;
      local_48.capa._4_4_ = 0;
      local_48.len._4_4_ = 0;
      goto LAB_001523f4;
    }
    switch(cVar4) {
    case '\'':
      pfVar9 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar9 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar9 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar9 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar9 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar9 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar9->to_str)(&local_48,uVar2);
  }
  else {
    fio_ltocstr(&local_48,(long)uVar2 >> 1);
  }
LAB_001523f4:
  iVar7 = http_sendfile2(h,settings->public_folder,settings->public_folder_length,local_48.data,
                         CONCAT44(local_48.len._4_4_,(undefined4)local_48.len));
  if (iVar7 == 0) {
    return;
  }
LAB_00152416:
  (*settings->on_request)(h);
  return;
}

Assistant:

void http_on_request_handler______internal(http_s *h,
                                           http_settings_s *settings) {
  if (!http_upgrade_hash)
    http_upgrade_hash = fiobj_hash_string("upgrade", 7);
  h->udata = settings->udata;

  static uint64_t host_hash = 0;
  if (!host_hash)
    host_hash = fiobj_hash_string("host", 4);

  if (1) {
    /* test for Host header and avoid duplicates */
    FIOBJ tmp = fiobj_hash_get2(h->headers, host_hash);
    if (!tmp)
      goto missing_host;
    if (FIOBJ_TYPE_IS(tmp, FIOBJ_T_ARRAY)) {
      fiobj_hash_set(h->headers, HTTP_HEADER_HOST, fiobj_ary_pop(tmp));
    }
  }

  FIOBJ t = fiobj_hash_get2(h->headers, http_upgrade_hash);
  if (t)
    goto upgrade;

  if (fiobj_iseq(
          fiobj_hash_get2(h->headers, fiobj_obj2hash(HTTP_HEADER_ACCEPT)),
          HTTP_HVALUE_SSE_MIME))
    goto eventsource;
  if (settings->public_folder) {
    fio_str_info_s path_str = fiobj_obj2cstr(h->path);
    if (!http_sendfile2(h, settings->public_folder,
                        settings->public_folder_length, path_str.data,
                        path_str.len)) {
      return;
    }
  }
  settings->on_request(h);
  return;

upgrade:
  if (1) {
    fiobj_dup(t); /* allow upgrade name access after http_finish */
    fio_str_info_s val = fiobj_obj2cstr(t);
    if (val.data[0] == 'h' && val.data[1] == '2') {
      http_send_error(h, 400);
    } else {
      settings->on_upgrade(h, val.data, val.len);
    }
    fiobj_free(t);
    return;
  }
eventsource:
  settings->on_upgrade(h, (char *)"sse", 3);
  return;
missing_host:
  FIO_LOG_DEBUG("missing Host header");
  http_send_error(h, 400);
  return;
}